

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_apply(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  uint64_t lab_03;
  uint64_t lab_04;
  uint64_t lab_05;
  uint64_t lab_06;
  uint64_t lab_07;
  uint64_t lab_08;
  uint64_t lab_09;
  uint64_t lab_10;
  uint64_t lab_11;
  operand local_9c8;
  operation local_9c4;
  unsigned_long local_9c0;
  operand local_9b4 [2];
  operation local_9ac;
  operand local_9a8 [2];
  operation local_9a0 [2];
  operand local_998 [2];
  operation local_990 [2];
  operand local_988;
  operation local_984;
  operand local_980;
  operation local_97c [5];
  operand local_968 [2];
  operation local_960;
  operand local_95c;
  operation local_958 [2];
  operand local_950 [2];
  operation local_948;
  operand local_944 [2];
  operation local_93c;
  operand local_938 [2];
  operation local_930 [2];
  operand local_928 [2];
  operation local_920 [2];
  undefined1 local_918 [8];
  string rep_arg_set_done;
  string rep_arg_set;
  operation local_8d0 [2];
  operand local_8c8 [2];
  operation local_8c0 [2];
  operand local_8b8 [2];
  operation local_8b0;
  operand local_8ac;
  operation local_8a8 [3];
  operand local_89c [2];
  operation local_894;
  operand local_890 [2];
  operation local_888 [2];
  operand local_880 [2];
  operation local_878 [3];
  operand local_86c [2];
  operation local_864;
  operand local_860 [2];
  operation local_858 [2];
  operand local_850 [2];
  operation local_848 [3];
  operand local_83c [2];
  operation local_834;
  operand local_830 [2];
  operation local_828 [2];
  operand local_820 [2];
  operation local_818 [3];
  operand local_80c [2];
  operation local_804;
  operand local_800 [2];
  operation local_7f8 [2];
  operand local_7f0 [2];
  operation local_7e8 [3];
  operand local_7dc [2];
  operation local_7d4;
  operand local_7d0 [2];
  operation local_7c8 [2];
  operand local_7c0 [2];
  operation local_7b8 [3];
  operand local_7ac [2];
  operation local_7a4;
  operand local_7a0 [2];
  operation local_798 [2];
  operand local_790 [2];
  operation local_788 [3];
  operand local_77c [2];
  operation local_774;
  operand local_770 [2];
  operation local_768 [2];
  operand local_760 [2];
  operation local_758 [3];
  operand local_74c [2];
  operation local_744;
  operand local_740 [2];
  operation local_738 [2];
  operand local_730 [2];
  operation local_728 [2];
  operand local_720 [2];
  operation local_718 [3];
  operand local_70c [2];
  operation local_704;
  undefined1 local_700 [8];
  string all_args_set;
  operation local_6d8;
  operand local_6d4;
  operation local_6d0 [2];
  operand local_6c8;
  operation local_6c4;
  operand local_6c0;
  operation local_6bc [2];
  operand local_6b4 [2];
  operation local_6ac;
  unsigned_long local_6a8;
  operand local_69c [2];
  operation local_694;
  operand local_690 [2];
  operation local_688 [2];
  operand local_680 [2];
  operation local_678 [2];
  operand local_670;
  operation local_66c;
  operand local_668;
  operation local_664 [5];
  operand local_650 [2];
  operation local_648;
  operand local_644;
  operation local_640 [2];
  operand local_638 [2];
  operation local_630;
  operand local_62c [2];
  operation local_624;
  operand local_620 [2];
  operation local_618 [2];
  operand local_610 [2];
  operation local_608 [2];
  undefined1 local_600 [8];
  string rep_arg_set_clos_done;
  string rep_arg_set_clos;
  operation local_5b8 [2];
  operand local_5b0 [2];
  operation local_5a8;
  operand local_5a4 [2];
  operation local_59c;
  operand local_598 [2];
  operation local_590 [2];
  operand local_588 [2];
  operation local_580 [2];
  operand local_578 [2];
  operation local_570 [2];
  operand local_568 [2];
  operation local_560;
  operand local_55c;
  operation local_558 [3];
  operand local_54c [2];
  operation local_544;
  operand local_540 [2];
  operation local_538 [2];
  operand local_530 [2];
  operation local_528 [3];
  operand local_51c [2];
  operation local_514;
  operand local_510 [2];
  operation local_508 [2];
  operand local_500 [2];
  operation local_4f8 [3];
  operand local_4ec [2];
  operation local_4e4;
  operand local_4e0 [2];
  operation local_4d8 [2];
  operand local_4d0 [2];
  operation local_4c8 [3];
  operand local_4bc [2];
  operation local_4b4;
  operand local_4b0 [2];
  operation local_4a8 [2];
  operand local_4a0 [2];
  operation local_498 [3];
  operand local_48c [2];
  operation local_484;
  operand local_480 [2];
  operation local_478 [2];
  operand local_470 [2];
  operation local_468 [3];
  operand local_45c [2];
  operation local_454;
  operand local_450 [2];
  operation local_448 [2];
  operand local_440 [2];
  operation local_438 [2];
  operand local_430 [2];
  operation local_428 [3];
  operand local_41c [2];
  operation local_414;
  undefined1 local_410 [8];
  string all_args_set_clos;
  operand local_3e8;
  operation local_3e4 [2];
  operand local_3dc [2];
  operation local_3d4 [2];
  operand local_3cc [2];
  operation local_3c4;
  operand local_3c0 [2];
  operation local_3b8;
  operand local_3b4 [3];
  operation local_3a8;
  operand local_3a4 [2];
  operation local_39c;
  operand local_398 [2];
  operation local_390;
  operand local_38c [2];
  operation local_384;
  unsigned_long local_380;
  operand local_374 [2];
  operation local_36c [2];
  operand local_364 [2];
  operation local_35c [2];
  operand local_354 [2];
  operation local_34c;
  unsigned_long local_348;
  operand local_340 [2];
  operation local_338 [3];
  operand local_32c [2];
  operation local_324 [2];
  operand local_31c [2];
  operation local_314;
  operand local_310 [2];
  operation local_308 [4];
  operand local_2f8 [2];
  operation local_2f0;
  operand local_2ec [2];
  operation local_2e4;
  unsigned_long local_2e0;
  operand local_2d8 [2];
  operation local_2d0 [3];
  operand local_2c4 [2];
  operation local_2bc [2];
  operand local_2b4 [2];
  operation local_2ac;
  operand local_2a8;
  operation local_2a4;
  operand local_2a0 [2];
  operation local_298 [2];
  operand local_290 [2];
  operation local_288 [2];
  unsigned_long local_280;
  operand local_278 [2];
  operation local_270 [3];
  operand local_264 [2];
  operation local_25c;
  operand local_258 [2];
  operation local_250 [2];
  operand local_248 [2];
  operation local_240;
  operand local_23c [2];
  operation local_234;
  undefined1 local_230 [8];
  string unraveled;
  string unravel;
  int local_1e8;
  operand local_1e4 [2];
  operation local_1dc;
  operand local_1d8;
  operation local_1d4 [3];
  operand local_1c8 [2];
  operation local_1c0 [2];
  undefined1 local_1b8 [8];
  string done;
  string repeat;
  operand local_170;
  operand local_16c;
  operation local_168;
  int local_164;
  operand local_160;
  operand local_15c;
  operation local_158;
  operand local_154;
  operand local_150;
  operation local_14c;
  operand local_148;
  int local_144;
  operand local_140;
  operation local_13c;
  operand local_138;
  int local_134;
  operand local_130;
  operation local_12c;
  operand local_128;
  int local_124;
  operand local_120;
  operation local_11c;
  operand local_118;
  int local_114;
  operand local_110;
  operation local_10c;
  operand local_108;
  int local_104;
  operand local_100;
  operation local_fc;
  operand local_f8;
  int local_f4;
  operand local_f0;
  operation local_ec;
  operand local_e8;
  int local_e4;
  operand local_e0;
  operation local_dc;
  operand local_d8;
  operand local_d4;
  operation local_d0;
  int local_cc;
  operand local_c8;
  operand local_c4;
  operation local_c0;
  operation local_bc;
  int local_b8;
  operand local_b4;
  operand local_b0;
  operation local_ac;
  string local_a8;
  undefined1 local_88 [8];
  string clos;
  undefined1 local_58 [8];
  string proc;
  string error;
  compiler_options *ops_local;
  asmcode *code_local;
  
  std::__cxx11::string::string((string *)(proc.field_2._M_local_buf + 8));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_58,psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_88,psVar1,lab_00);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_a8,psVar1,lab_01);
    std::__cxx11::string::operator=((string *)(proc.field_2._M_local_buf + 8),(string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    local_ac = CMP;
    local_b0 = R11;
    local_b4 = NUMBER;
    local_b8 = 2;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&stack0xffffffffffffff54,&stack0xffffffffffffff50,&stack0xffffffffffffff4c,
               &stack0xffffffffffffff48);
    local_bc = JL;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,&stack0xffffffffffffff44,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&proc.field_2 + 8));
  }
  local_c0 = MOV;
  local_c4 = RAX;
  local_c8 = MEM_R10;
  local_cc = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&stack0xffffffffffffff40,&stack0xffffffffffffff3c,&stack0xffffffffffffff38,
             &stack0xffffffffffffff34);
  local_d0 = MOV;
  local_d4 = MEM_RAX;
  local_d8 = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&stack0xffffffffffffff30,&stack0xffffffffffffff2c,&stack0xffffffffffffff28);
  local_dc = MOV;
  local_e0 = MEM_RAX;
  local_e4 = 8;
  local_e8 = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&stack0xffffffffffffff24,&stack0xffffffffffffff20,&stack0xffffffffffffff1c,
             &stack0xffffffffffffff18);
  local_ec = MOV;
  local_f0 = MEM_RAX;
  local_f4 = 0x10;
  local_f8 = RSI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&stack0xffffffffffffff14,&stack0xffffffffffffff10,&stack0xffffffffffffff0c,
             &stack0xffffffffffffff08);
  local_fc = MOV;
  local_100 = MEM_RAX;
  local_104 = 0x18;
  local_108 = RDI;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&stack0xffffffffffffff04,&stack0xffffffffffffff00,&stack0xfffffffffffffefc,
             &stack0xfffffffffffffef8);
  local_10c = MOV;
  local_110 = MEM_RAX;
  local_114 = 0x20;
  local_118 = R8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&stack0xfffffffffffffef4,&stack0xfffffffffffffef0,&stack0xfffffffffffffeec,
             &stack0xfffffffffffffee8);
  local_11c = MOV;
  local_120 = MEM_RAX;
  local_124 = 0x28;
  local_128 = R9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&stack0xfffffffffffffee4,&stack0xfffffffffffffee0,&stack0xfffffffffffffedc,
             &stack0xfffffffffffffed8);
  local_12c = MOV;
  local_130 = MEM_RAX;
  local_134 = 0x30;
  local_138 = R12;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&stack0xfffffffffffffed4,&stack0xfffffffffffffed0,&stack0xfffffffffffffecc,
             &stack0xfffffffffffffec8);
  local_13c = MOV;
  local_140 = MEM_RAX;
  local_144 = 0x38;
  local_148 = R14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&stack0xfffffffffffffec4,&stack0xfffffffffffffec0,&stack0xfffffffffffffebc,
             &stack0xfffffffffffffeb8);
  local_14c = MOV;
  local_150 = RDX;
  local_154 = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&stack0xfffffffffffffeb4,&stack0xfffffffffffffeb0,&stack0xfffffffffffffeac);
  local_158 = ADD;
  local_15c = RAX;
  local_160 = NUMBER;
  local_164 = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&stack0xfffffffffffffea8,&stack0xfffffffffffffea4,&stack0xfffffffffffffea0,
             &stack0xfffffffffffffe9c);
  local_168 = SUB;
  local_16c = R11;
  local_170 = NUMBER;
  repeat.field_2._12_4_ = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&stack0xfffffffffffffe98,&stack0xfffffffffffffe94,&stack0xfffffffffffffe90,
             (int *)(repeat.field_2._M_local_buf + 0xc));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&done.field_2 + 8),psVar1,lab_02);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_1b8,psVar1,lab_03);
  local_1c0[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1c0 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  local_1c0[0] = CMP;
  local_1c8[1] = 0x14;
  local_1c8[0] = NUMBER;
  local_1d4[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1c0,local_1c8 + 1,local_1c8,(int *)(local_1d4 + 2));
  local_1d4[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1d4 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  local_1d4[0] = DEC;
  local_1d8 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_1d4,&local_1d8);
  local_1dc = ADD;
  local_1e4[1] = 9;
  local_1e4[0] = NUMBER;
  local_1e8 = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1dc,local_1e4 + 1,local_1e4,&stack0xfffffffffffffe18);
  unravel.field_2._12_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)(unravel.field_2._M_local_buf + 0xc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  unravel.field_2._8_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)(unravel.field_2._M_local_buf + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&unraveled.field_2 + 8),psVar1,lab_04);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_230,psVar1,lab_05);
  local_234 = MOV;
  local_23c[1] = 0x14;
  local_23c[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_234,local_23c + 1,local_23c);
  local_240 = SUB;
  local_248[1] = 0x14;
  local_248[0] = NUMBER;
  local_250[1] = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_240,local_248 + 1,local_248,(int *)(local_250 + 1));
  local_250[0] = MOV;
  local_258[1] = 0x18;
  local_258[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_250,local_258 + 1,local_258);
  local_25c = CMP;
  local_264[1] = 0x18;
  local_264[0] = NUMBER;
  local_270[2] = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_25c,local_264 + 1,local_264,(int *)(local_270 + 2));
  local_270[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_270 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_is_not_block(code,R15,RDX,(string *)((long)&proc.field_2 + 8));
  }
  local_270[0] = AND;
  local_278[1] = 0x18;
  local_278[0] = NUMBER;
  local_280 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_270,local_278 + 1,local_278,&local_280);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_does_not_point_to_pair(code,R15,RDX,(string *)((long)&proc.field_2 + 8));
  }
  local_288[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_288 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&unraveled.field_2 + 8));
  local_288[0] = MOV;
  local_290[1] = 0xc;
  local_290[0] = MEM_R15;
  local_298[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_288,local_290 + 1,local_290,(int *)(local_298 + 1));
  local_298[0] = MOV;
  local_2a0[1] = 0x19;
  local_2a0[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_298,local_2a0 + 1,local_2a0);
  local_2a4 = INC;
  local_2a8 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_2a4,&local_2a8);
  local_2ac = MOV;
  local_2b4[1] = 0xc;
  local_2b4[0] = MEM_R15;
  local_2bc[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_2ac,local_2b4 + 1,local_2b4,(int *)(local_2bc + 1));
  local_2bc[0] = CMP;
  local_2c4[1] = 0xc;
  local_2c4[0] = NUMBER;
  local_2d0[2] = 0x1f;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2bc,local_2c4 + 1,local_2c4,(int *)(local_2d0 + 2));
  local_2d0[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2d0 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_is_not_block(code,RDX,R15,(string *)((long)&proc.field_2 + 8));
  }
  local_2d0[0] = AND;
  local_2d8[1] = 0xc;
  local_2d8[0] = NUMBER;
  local_2e0 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_2d0,local_2d8 + 1,local_2d8,&local_2e0);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_does_not_point_to_pair(code,RDX,R15,(string *)((long)&proc.field_2 + 8));
  }
  local_2e4 = MOV;
  local_2ec[1] = 0x18;
  local_2ec[0] = RDX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_2e4,local_2ec + 1,local_2ec);
  local_2f0 = ADD;
  local_2f8[1] = 9;
  local_2f8[0] = NUMBER;
  local_308[3] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_2f0,local_2f8 + 1,local_2f8,(int *)(local_308 + 3));
  local_308[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_308 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&unraveled.field_2 + 8));
  local_308[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_308 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230);
  local_308[0] = MOV;
  local_310[1] = 9;
  local_310[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_308,local_310 + 1,local_310);
  local_314 = AND;
  local_31c[1] = 9;
  local_31c[0] = NUMBER;
  local_324[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_314,local_31c + 1,local_31c,(int *)(local_324 + 1));
  local_324[0] = CMP;
  local_32c[1] = 9;
  local_32c[0] = NUMBER;
  local_338[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_324,local_32c + 1,local_32c,(int *)(local_338 + 2));
  local_338[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_338 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_is_not_block(code,RCX,R15,(string *)((long)&proc.field_2 + 8));
    local_338[0] = AND;
    local_340[1] = 0xb;
    local_340[0] = NUMBER;
    local_348 = 0xfffffffffffffff8;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
              (code,local_338,local_340 + 1,local_340,&local_348);
    jump_if_arg_does_not_point_to_closure(code,RCX,R15,(string *)((long)&proc.field_2 + 8));
    local_34c = OR;
    local_354[1] = 0xb;
    local_354[0] = NUMBER;
    local_35c[1] = 5;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,&local_34c,local_354 + 1,local_354,(int *)(local_35c + 1));
  }
  local_35c[0] = MOV;
  local_364[1] = 9;
  local_364[0] = NUMBER;
  local_36c[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_35c,local_364 + 1,local_364,(int *)(local_36c + 1));
  local_36c[0] = MOV;
  local_374[1] = 0x18;
  local_374[0] = NUMBER;
  local_380 = 0x400000000000000;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_36c,local_374 + 1,local_374,&local_380);
  local_384 = OR;
  local_38c[1] = 9;
  local_38c[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_384,local_38c + 1,local_38c);
  local_390 = MOV;
  local_398[1] = 0x20;
  local_398[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_390,local_398 + 1,local_398);
  local_39c = MOV;
  local_3a4[1] = 0x18;
  local_3a4[0] = LABELADDRESS;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,char_const(&)[11]>
            (code,&local_39c,local_3a4 + 1,local_3a4,(char (*) [11])"L_identity");
  local_3a8 = MOV;
  local_3b4[2] = 0x20;
  local_3b4[1] = 8;
  local_3b4[0] = R15;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
            (code,&local_3a8,local_3b4 + 2,(int *)(local_3b4 + 1),local_3b4);
  local_3b8 = MOV;
  local_3c0[1] = 0x18;
  local_3c0[0] = RBP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_3b8,local_3c0 + 1,local_3c0);
  local_3c4 = OR;
  local_3cc[1] = 0x18;
  local_3cc[0] = NUMBER;
  local_3d4[1] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_3c4,local_3cc + 1,local_3cc,(int *)(local_3d4 + 1));
  local_3d4[0] = ADD;
  local_3dc[1] = 0x10;
  local_3dc[0] = NUMBER;
  local_3e4[1] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_3d4,local_3dc + 1,local_3dc,(int *)(local_3e4 + 1));
  local_3e4[0] = MOV;
  local_3e8 = RDX;
  all_args_set_clos.field_2._12_4_ = 0x18;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_3e4,&stack0xfffffffffffffc18,
             (operand *)(all_args_set_clos.field_2._M_local_buf + 0xc));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_410,psVar1,lab_06);
  local_414 = CMP;
  local_41c[1] = 0x14;
  local_41c[0] = NUMBER;
  local_428[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_414,local_41c + 1,local_41c,(int *)(local_428 + 2));
  local_428[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_428 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  local_428[0] = MOV;
  local_430[1] = 9;
  local_430[0] = MEM_R10;
  local_438[1] = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_428,local_430 + 1,local_430,(int *)(local_438 + 1));
  local_438[0] = ADD;
  local_440[1] = 9;
  local_440[0] = NUMBER;
  local_448[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_438,local_440 + 1,local_440,(int *)(local_448 + 1));
  local_448[0] = MOV;
  local_450[1] = 0xd;
  local_450[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_448,local_450 + 1,local_450);
  local_454 = CMP;
  local_45c[1] = 0x14;
  local_45c[0] = NUMBER;
  local_468[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_454,local_45c + 1,local_45c,(int *)(local_468 + 2));
  local_468[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_468 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  local_468[0] = ADD;
  local_470[1] = 9;
  local_470[0] = NUMBER;
  local_478[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_468,local_470 + 1,local_470,(int *)(local_478 + 1));
  local_478[0] = MOV;
  local_480[1] = 0xe;
  local_480[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_478,local_480 + 1,local_480);
  local_484 = CMP;
  local_48c[1] = 0x14;
  local_48c[0] = NUMBER;
  local_498[2] = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_484,local_48c + 1,local_48c,(int *)(local_498 + 2));
  local_498[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_498 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  local_498[0] = ADD;
  local_4a0[1] = 9;
  local_4a0[0] = NUMBER;
  local_4a8[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_498,local_4a0 + 1,local_4a0,(int *)(local_4a8 + 1));
  local_4a8[0] = MOV;
  local_4b0[1] = 0x11;
  local_4b0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_4a8,local_4b0 + 1,local_4b0);
  local_4b4 = CMP;
  local_4bc[1] = 0x14;
  local_4bc[0] = NUMBER;
  local_4c8[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_4b4,local_4bc + 1,local_4bc,(int *)(local_4c8 + 2));
  local_4c8[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_4c8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  local_4c8[0] = ADD;
  local_4d0[1] = 9;
  local_4d0[0] = NUMBER;
  local_4d8[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_4c8,local_4d0 + 1,local_4d0,(int *)(local_4d8 + 1));
  local_4d8[0] = MOV;
  local_4e0[1] = 0x12;
  local_4e0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_4d8,local_4e0 + 1,local_4e0);
  local_4e4 = CMP;
  local_4ec[1] = 0x14;
  local_4ec[0] = NUMBER;
  local_4f8[2] = 4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_4e4,local_4ec + 1,local_4ec,(int *)(local_4f8 + 2));
  local_4f8[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_4f8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  local_4f8[0] = ADD;
  local_500[1] = 9;
  local_500[0] = NUMBER;
  local_508[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_4f8,local_500 + 1,local_500,(int *)(local_508 + 1));
  local_508[0] = MOV;
  local_510[1] = 0x15;
  local_510[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_508,local_510 + 1,local_510);
  local_514 = CMP;
  local_51c[1] = 0x14;
  local_51c[0] = NUMBER;
  local_528[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_514,local_51c + 1,local_51c,(int *)(local_528 + 2));
  local_528[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_528 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  local_528[0] = ADD;
  local_530[1] = 9;
  local_530[0] = NUMBER;
  local_538[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_528,local_530 + 1,local_530,(int *)(local_538 + 1));
  local_538[0] = MOV;
  local_540[1] = 0x17;
  local_540[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_538,local_540 + 1,local_540);
  local_544 = CMP;
  local_54c[1] = 0x14;
  local_54c[0] = NUMBER;
  local_558[2] = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_544,local_54c + 1,local_54c,(int *)(local_558 + 2));
  local_558[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_558 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  local_558[0] = PUSH;
  local_55c = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_558,&local_55c);
  local_560 = SUB;
  local_568[1] = 0x14;
  local_568[0] = NUMBER;
  local_570[1] = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_560,local_568 + 1,local_568,(int *)(local_570 + 1));
  local_570[0] = MOV;
  local_578[1] = 0x18;
  local_578[0] = MEM_R10;
  local_580[1] = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_570,local_578 + 1,local_578,(int *)(local_580 + 1));
  local_580[0] = SHL;
  local_588[1] = 0x14;
  local_588[0] = NUMBER;
  local_590[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_580,local_588 + 1,local_588,(int *)(local_590 + 1));
  local_590[0] = ADD;
  local_598[1] = 0x18;
  local_598[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_590,local_598 + 1,local_598);
  local_59c = ADD;
  local_5a4[1] = 9;
  local_5a4[0] = R11;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_59c,local_5a4 + 1,local_5a4);
  local_5a8 = SHR;
  local_5b0[1] = 0x14;
  local_5b0[0] = NUMBER;
  local_5b8[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_5a8,local_5b0 + 1,local_5b0,(int *)(local_5b8 + 1));
  local_5b8[0] = PUSH;
  rep_arg_set_clos.field_2._12_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_5b8,(operand *)(rep_arg_set_clos.field_2._M_local_buf + 0xc));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&rep_arg_set_clos_done.field_2 + 8),psVar1,lab_07);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_600,psVar1,lab_08);
  local_608[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_608 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rep_arg_set_clos_done.field_2 + 8));
  local_608[0] = SUB;
  local_610[1] = 0x18;
  local_610[0] = NUMBER;
  local_618[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_608,local_610 + 1,local_610,(int *)(local_618 + 1));
  local_618[0] = MOV;
  local_620[1] = 0xb;
  local_620[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_618,local_620 + 1,local_620);
  local_624 = MOV;
  local_62c[1] = 0x28;
  local_62c[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_624,local_62c + 1,local_62c);
  local_630 = SUB;
  local_638[1] = 9;
  local_638[0] = NUMBER;
  local_640[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_630,local_638 + 1,local_638,(int *)(local_640 + 1));
  local_640[0] = DEC;
  local_644 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_640,&local_644);
  local_648 = CMP;
  local_650[1] = 0x14;
  local_650[0] = NUMBER;
  local_664[4] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_648,local_650 + 1,local_650,(int *)(local_664 + 4));
  local_664[3] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_664 + 3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600);
  local_664[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_664 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rep_arg_set_clos_done.field_2 + 8));
  local_664[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_664 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600);
  local_664[0] = POP;
  local_668 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_664,&local_668);
  local_66c = POP;
  local_670 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_66c,&local_670);
  local_678[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_678 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_410);
  local_678[0] = ADD;
  local_680[1] = 0x14;
  local_680[0] = NUMBER;
  local_688[1] = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_678,local_680 + 1,local_680,(int *)(local_688 + 1));
  local_688[0] = MOV;
  local_690[1] = 9;
  local_690[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_688,local_690 + 1,local_690);
  local_694 = AND;
  local_69c[1] = 9;
  local_69c[0] = NUMBER;
  local_6a8 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_694,local_69c + 1,local_69c,&local_6a8);
  local_6ac = MOV;
  local_6b4[1] = 0x18;
  local_6b4[0] = MEM_RAX;
  local_6bc[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_6ac,local_6b4 + 1,local_6b4,(int *)(local_6bc + 1));
  local_6bc[0] = PUSH;
  local_6c0 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_6bc,&local_6c0);
  local_6c4 = JMP;
  local_6c8 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_6c4,&local_6c8);
  local_6d0[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[23]>
            (code,local_6d0 + 1,(char (*) [23])"L_return_from_identity");
  local_6d0[0] = POP;
  local_6d4 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_6d0,&local_6d4);
  local_6d8 = JMP;
  all_args_set.field_2._12_4_ = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_6d8,(operand *)(all_args_set.field_2._M_local_buf + 0xc));
  all_args_set.field_2._8_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)(all_args_set.field_2._M_local_buf + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_700,psVar1,lab_09);
  local_704 = CMP;
  local_70c[1] = 0x14;
  local_70c[0] = NUMBER;
  local_718[2] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_704,local_70c + 1,local_70c,(int *)(local_718 + 2));
  local_718[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_718 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_718[0] = MOV;
  local_720[1] = 9;
  local_720[0] = MEM_R10;
  local_728[1] = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_718,local_720 + 1,local_720,(int *)(local_728 + 1));
  local_728[0] = ADD;
  local_730[1] = 9;
  local_730[0] = NUMBER;
  local_738[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_728,local_730 + 1,local_730,(int *)(local_738 + 1));
  local_738[0] = MOV;
  local_740[1] = 0xb;
  local_740[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_738,local_740 + 1,local_740);
  local_744 = CMP;
  local_74c[1] = 0x14;
  local_74c[0] = NUMBER;
  local_758[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_744,local_74c + 1,local_74c,(int *)(local_758 + 2));
  local_758[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_758 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_758[0] = ADD;
  local_760[1] = 9;
  local_760[0] = NUMBER;
  local_768[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_758,local_760 + 1,local_760,(int *)(local_768 + 1));
  local_768[0] = MOV;
  local_770[1] = 0xc;
  local_770[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_768,local_770 + 1,local_770);
  local_774 = CMP;
  local_77c[1] = 0x14;
  local_77c[0] = NUMBER;
  local_788[2] = 2;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_774,local_77c + 1,local_77c,(int *)(local_788 + 2));
  local_788[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_788 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_788[0] = ADD;
  local_790[1] = 9;
  local_790[0] = NUMBER;
  local_798[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_788,local_790 + 1,local_790,(int *)(local_798 + 1));
  local_798[0] = MOV;
  local_7a0[1] = 0xd;
  local_7a0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_798,local_7a0 + 1,local_7a0);
  local_7a4 = CMP;
  local_7ac[1] = 0x14;
  local_7ac[0] = NUMBER;
  local_7b8[2] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_7a4,local_7ac + 1,local_7ac,(int *)(local_7b8 + 2));
  local_7b8[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_7b8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_7b8[0] = ADD;
  local_7c0[1] = 9;
  local_7c0[0] = NUMBER;
  local_7c8[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_7b8,local_7c0 + 1,local_7c0,(int *)(local_7c8 + 1));
  local_7c8[0] = MOV;
  local_7d0[1] = 0xe;
  local_7d0[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_7c8,local_7d0 + 1,local_7d0);
  local_7d4 = CMP;
  local_7dc[1] = 0x14;
  local_7dc[0] = NUMBER;
  local_7e8[2] = 4;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_7d4,local_7dc + 1,local_7dc,(int *)(local_7e8 + 2));
  local_7e8[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_7e8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_7e8[0] = ADD;
  local_7f0[1] = 9;
  local_7f0[0] = NUMBER;
  local_7f8[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_7e8,local_7f0 + 1,local_7f0,(int *)(local_7f8 + 1));
  local_7f8[0] = MOV;
  local_800[1] = 0x11;
  local_800[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_7f8,local_800 + 1,local_800);
  local_804 = CMP;
  local_80c[1] = 0x14;
  local_80c[0] = NUMBER;
  local_818[2] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_804,local_80c + 1,local_80c,(int *)(local_818 + 2));
  local_818[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_818 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_818[0] = ADD;
  local_820[1] = 9;
  local_820[0] = NUMBER;
  local_828[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_818,local_820 + 1,local_820,(int *)(local_828 + 1));
  local_828[0] = MOV;
  local_830[1] = 0x12;
  local_830[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_828,local_830 + 1,local_830);
  local_834 = CMP;
  local_83c[1] = 0x14;
  local_83c[0] = NUMBER;
  local_848[2] = 6;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_834,local_83c + 1,local_83c,(int *)(local_848 + 2));
  local_848[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_848 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_848[0] = ADD;
  local_850[1] = 9;
  local_850[0] = NUMBER;
  local_858[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_848,local_850 + 1,local_850,(int *)(local_858 + 1));
  local_858[0] = MOV;
  local_860[1] = 0x15;
  local_860[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_858,local_860 + 1,local_860);
  local_864 = CMP;
  local_86c[1] = 0x14;
  local_86c[0] = NUMBER;
  local_878[2] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_864,local_86c + 1,local_86c,(int *)(local_878 + 2));
  local_878[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_878 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_878[0] = ADD;
  local_880[1] = 9;
  local_880[0] = NUMBER;
  local_888[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_878,local_880 + 1,local_880,(int *)(local_888 + 1));
  local_888[0] = MOV;
  local_890[1] = 0x17;
  local_890[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_888,local_890 + 1,local_890);
  local_894 = CMP;
  local_89c[1] = 0x14;
  local_89c[0] = NUMBER;
  local_8a8[2] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_894,local_89c + 1,local_89c,(int *)(local_8a8 + 2));
  local_8a8[1] = 0x2f;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_8a8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_8a8[0] = PUSH;
  local_8ac = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_8a8,&local_8ac);
  local_8b0 = SUB;
  local_8b8[1] = 0x14;
  local_8b8[0] = NUMBER;
  local_8c0[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_8b0,local_8b8 + 1,local_8b8,(int *)(local_8c0 + 1));
  local_8c0[0] = MOV;
  local_8c8[1] = 0x18;
  local_8c8[0] = MEM_R10;
  local_8d0[1] = 0x88;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_8c0,local_8c8 + 1,local_8c8,(int *)(local_8d0 + 1));
  local_8d0[0] = PUSH;
  rep_arg_set.field_2._12_4_ = 0xb;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_8d0,(operand *)(rep_arg_set.field_2._M_local_buf + 0xc));
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&rep_arg_set_done.field_2 + 8),psVar1,lab_10);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_918,psVar1,lab_11);
  local_920[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_920 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rep_arg_set_done.field_2 + 8));
  local_920[0] = ADD;
  local_928[1] = 9;
  local_928[0] = NUMBER;
  local_930[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_920,local_928 + 1,local_928,(int *)(local_930 + 1));
  local_930[0] = MOV;
  local_938[1] = 0xb;
  local_938[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_930,local_938 + 1,local_938);
  local_93c = MOV;
  local_944[1] = 0x28;
  local_944[0] = RCX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_93c,local_944 + 1,local_944);
  local_948 = ADD;
  local_950[1] = 0x18;
  local_950[0] = NUMBER;
  local_958[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_948,local_950 + 1,local_950,(int *)(local_958 + 1));
  local_958[0] = DEC;
  local_95c = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_958,&local_95c);
  local_960 = CMP;
  local_968[1] = 0x14;
  local_968[0] = NUMBER;
  local_97c[4] = 0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_960,local_968 + 1,local_968,(int *)(local_97c + 4));
  local_97c[3] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_97c + 3,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918);
  local_97c[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_97c + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&rep_arg_set_done.field_2 + 8));
  local_97c[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_97c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_918);
  local_97c[0] = POP;
  local_980 = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_97c,&local_980);
  local_984 = POP;
  local_988 = R11;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_984,&local_988);
  local_990[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_990 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700);
  local_990[0] = MOV;
  local_998[1] = 9;
  local_998[0] = MEM_R10;
  local_9a0[1] = 0xa0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_990,local_998 + 1,local_998,(int *)(local_9a0 + 1));
  local_9a0[0] = MOV;
  local_9a8[1] = 0x18;
  local_9a8[0] = MEM_RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_9a0,local_9a8 + 1,local_9a8);
  local_9ac = AND;
  local_9b4[1] = 0x18;
  local_9b4[0] = NUMBER;
  local_9c0 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_9ac,local_9b4 + 1,local_9b4,&local_9c0);
  local_9c4 = JMP;
  local_9c8 = R15;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_9c4,&local_9c8);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)((long)&proc.field_2 + 8),re_apply_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_918);
  std::__cxx11::string::~string((string *)(rep_arg_set_done.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_700);
  std::__cxx11::string::~string((string *)local_600);
  std::__cxx11::string::~string((string *)(rep_arg_set_clos_done.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_410);
  std::__cxx11::string::~string((string *)local_230);
  std::__cxx11::string::~string((string *)(unraveled.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)(done.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(proc.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_apply(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string proc = label_to_string(label++);
  std::string clos = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
    code.add(asmcode::JL, error);
    }

  //we move all registers in GC_SAVE, then all args are linear in memory (GC_SAVE is followed by LOCALS)
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::MOV, asmcode::MEM_RAX, asmcode::RCX);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(1), asmcode::RDX);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(2), asmcode::RSI);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(3), asmcode::RDI);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(4), asmcode::R8);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(5), asmcode::R9);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(6), asmcode::R12);
  code.add(asmcode::MOV, asmcode::MEM_RAX, CELLS(7), asmcode::R14);

  code.add(asmcode::MOV, asmcode::RDX, asmcode::R11); // save r11 in rdx

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1)); // mem_rax now points to rdx = 2nd arg
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 2);

  //now we look for the last argument, which should be a list
  std::string repeat = label_to_string(label++);
  std::string done = label_to_string(label++);
  code.add(asmcode::LABEL, repeat);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, done); // last arg found, is in mem_rax
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, repeat);
  code.add(asmcode::LABEL, done);

  std::string unravel = label_to_string(label++);
  std::string unraveled = label_to_string(label++);

  code.add(asmcode::MOV, asmcode::R11, asmcode::RDX); // get length again
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 2);
  // mem_rax now contains a list, let's check
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R15, asmcode::NUMBER, nil); // last element is nil, so that's fine
  code.add(asmcode::JE, unraveled);
  if (ops.safe_primitives)
    jump_if_arg_is_not_block(code, asmcode::R15, asmcode::RDX, error);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_if_arg_does_not_point_to_pair(code, asmcode::R15, asmcode::RDX, error);

  code.add(asmcode::LABEL, unravel);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_R15, CELLS(1)); // get car of pair in rdx
  code.add(asmcode::MOV, asmcode::MEM_RAX, asmcode::RDX);
  code.add(asmcode::INC, asmcode::R11);
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_R15, CELLS(2)); // get cdr of pair in rdx
  code.add(asmcode::CMP, asmcode::RDX, asmcode::NUMBER, nil); // last element is nil, so all elements are unpacked
  code.add(asmcode::JE, unraveled);
  if (ops.safe_primitives)
    jump_if_arg_is_not_block(code, asmcode::RDX, asmcode::R15, error);
  code.add(asmcode::AND, asmcode::RDX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_if_arg_does_not_point_to_pair(code, asmcode::RDX, asmcode::R15, error);
  code.add(asmcode::MOV, asmcode::R15, asmcode::RDX);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::JMPS, unravel);
  code.add(asmcode::LABEL, unraveled);


  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, procedure_mask);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::NUMBER, procedure_tag);
  code.add(asmcode::JE, proc);
  if (ops.safe_primitives)
    {
    jump_if_arg_is_not_block(code, asmcode::RCX, asmcode::R15, error);
    code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
    jump_if_arg_does_not_point_to_closure(code, asmcode::RCX, asmcode::R15, error);
    code.add(asmcode::OR, asmcode::RCX, asmcode::NUMBER, block_tag); // add block tag again
    }
  // if we are here, then the apply is on a closure in rcx

  //first we make a fake cps object
  // todo: move this to the context. We don't need to create one each apply. We could reserve memory for it in the context
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::MOV, asmcode::R15, asmcode::NUMBER, (uint64_t)closure_tag << (uint64_t)block_shift);
  code.add(asmcode::OR, asmcode::RAX, asmcode::R15);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::MOV, asmcode::R15, asmcode::LABELADDRESS, "L_identity");
  code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::R15);
  code.add(asmcode::MOV, asmcode::R15, ALLOC);
  code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));

  //rcx is ok, it contains the closure
  code.add(asmcode::MOV, asmcode::RDX, asmcode::R15); // the cps object in rdx

  auto all_args_set_clos = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, all_args_set_clos);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RSI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R9, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R12, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R14, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JE, all_args_set_clos);

  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::MOV, asmcode::R15, LOCAL);
  /*
  We have to go from the end to the front, as we'll otherwise overwrite data we still need, as GC_SAVE and LOCAL are next to each other in memory
  */
  code.add(asmcode::SHL, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::ADD, asmcode::R15, asmcode::R11);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::R11);
  code.add(asmcode::SHR, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::PUSH, asmcode::RCX);

  auto rep_arg_set_clos = label_to_string(label++);
  auto rep_arg_set_clos_done = label_to_string(label++);
  code.add(asmcode::LABEL, rep_arg_set_clos);
  code.add(asmcode::SUB, asmcode::R15, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::MOV, asmcode::MEM_R15, asmcode::RCX);
  code.add(asmcode::SUB, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, rep_arg_set_clos_done);
  code.add(asmcode::JMPS, rep_arg_set_clos);
  code.add(asmcode::LABEL, rep_arg_set_clos_done);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::LABEL, all_args_set_clos);
  code.add(asmcode::ADD, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::RCX);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX, CELLS(1));

  code.add(asmcode::PUSH, CONTINUE);
  code.add(asmcode::JMP, asmcode::R15); // call closure  
  code.add(asmcode::LABEL, "L_return_from_identity");

  code.add(asmcode::POP, CONTINUE);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, proc);
  // if we are here, then the apply is on a procedure in rcx

  auto all_args_set = label_to_string(label++);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JE, all_args_set);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
  code.add(asmcode::JE, all_args_set);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDX, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 2);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RSI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 3);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RDI, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 4);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R8, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 5);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R9, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 6);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R12, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 7);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::R14, asmcode::MEM_RAX);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::JE, all_args_set);

  code.add(asmcode::PUSH, asmcode::R11);
  code.add(asmcode::SUB, asmcode::R11, asmcode::NUMBER, 8);
  code.add(asmcode::MOV, asmcode::R15, LOCAL);
  code.add(asmcode::PUSH, asmcode::RCX);
  /*
  We have to go from the front to the end (as opposed to the case for closures above), as we'll otherwise overwrite data we still need, as GC_SAVE and LOCAL are next to each other in memory
  */
  auto rep_arg_set = label_to_string(label++);
  auto rep_arg_set_done = label_to_string(label++);
  code.add(asmcode::LABEL, rep_arg_set);
  code.add(asmcode::ADD, asmcode::RAX, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RAX);
  code.add(asmcode::MOV, asmcode::MEM_R15, asmcode::RCX);
  code.add(asmcode::ADD, asmcode::R15, asmcode::NUMBER, CELLS(1));
  code.add(asmcode::DEC, asmcode::R11);
  code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 0);
  code.add(asmcode::JES, rep_arg_set_done);
  code.add(asmcode::JMPS, rep_arg_set);
  code.add(asmcode::LABEL, rep_arg_set_done);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::POP, asmcode::R11);
  code.add(asmcode::LABEL, all_args_set);
  code.add(asmcode::MOV, asmcode::RAX, GC_SAVE);
  code.add(asmcode::MOV, asmcode::R15, asmcode::MEM_RAX);
  code.add(asmcode::AND, asmcode::R15, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8); // get procedure address
  code.add(asmcode::JMP, asmcode::R15); // call primitive

  if (ops.safe_primitives)
    {
    error_label(code, error, re_apply_contract_violation);
    }
  }